

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Vector4 ColorNormalize(Color color)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [16];
  Vector4 VVar3;
  
  auVar1[0xc] = color.a;
  auVar1._0_12_ = ZEXT712(0);
  auVar2._0_4_ = (float)((uint)color & 0xff);
  auVar2._4_4_ = (float)((uint)color >> 8 & 0xff);
  auVar2._8_4_ = (float)(int)CONCAT32(auVar1._10_3_,(ushort)color.b);
  auVar2._12_4_ = (float)(uint3)(auVar1._10_3_ >> 0x10);
  VVar3 = (Vector4)divps(auVar2,_DAT_00164bf0);
  return VVar3;
}

Assistant:

Vector4 ColorNormalize(Color color)
{
    Vector4 result;

    result.x = (float)color.r/255.0f;
    result.y = (float)color.g/255.0f;
    result.z = (float)color.b/255.0f;
    result.w = (float)color.a/255.0f;

    return result;
}